

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O3

void If_Dec6Verify(word t,word z)

{
  word r;
  word local_20;
  word local_18;
  
  local_18 = t;
  local_20 = If_Dec6Truth(z);
  if (local_20 != t) {
    If_DecPrintConfig(z);
    Kit_DsdPrintFromTruth((uint *)&local_18,6);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)&local_20,6);
    putchar(10);
    puts("Verification failed!");
  }
  return;
}

Assistant:

void If_Dec6Verify( word t, word z )
{
    word r = If_Dec6Truth( z );
    if ( r != t )
    {
        If_DecPrintConfig( z );
        Kit_DsdPrintFromTruth( (unsigned*)&t, 6 ); printf( "\n" );
//        Kit_DsdPrintFromTruth( (unsigned*)&q, 6 ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)&r, 6 ); printf( "\n" );
        printf( "Verification failed!\n" );
    }
}